

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *this_00;
  TestEventListeners *this_01;
  UnitTest *in_RSI;
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_ffffffffffffff38;
  TestResult *in_stack_ffffffffffffff40;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *listener;
  TestEventListeners *this_02;
  TestPartResultReporterInterface **in_stack_ffffffffffffff58;
  TestEventListeners *in_stack_ffffffffffffff60;
  Mutex *in_stack_ffffffffffffff70;
  
  in_RDI->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_001f8ff0;
  in_RDI->parent_ = in_RSI;
  FilePath::FilePath((FilePath *)in_stack_ffffffffffffff60);
  DefaultGlobalTestPartResultReporter::DefaultGlobalTestPartResultReporter
            ((DefaultGlobalTestPartResultReporter *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  DefaultPerThreadTestPartResultReporter::DefaultPerThreadTestPartResultReporter
            ((DefaultPerThreadTestPartResultReporter *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  in_RDI->global_test_part_result_repoter_ =
       &(in_RDI->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(in_stack_ffffffffffffff70);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::ThreadLocal
            ((ThreadLocal<testing::TestPartResultReporterInterface_*> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::vector
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)0x18ee38);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::vector
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)0x18ee51);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18ee6a);
  ParameterizedTestSuiteRegistry::ParameterizedTestSuiteRegistry
            ((ParameterizedTestSuiteRegistry *)0x18ee83);
  TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteRegistry
            ((TypeParameterizedTestSuiteRegistry *)0x18ee9e);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x18eeb7);
  in_RDI->parameterized_tests_registered_ = false;
  in_RDI->last_death_test_suite_ = -1;
  in_RDI->current_test_suite_ = (TestSuite *)0x0;
  in_RDI->current_test_info_ = (TestInfo *)0x0;
  TestResult::TestResult(in_stack_ffffffffffffff40);
  TestEventListeners::TestEventListeners(in_stack_ffffffffffffff60);
  in_RDI->os_stack_trace_getter_ = (OsStackTraceGetterInterface *)0x0;
  in_RDI->post_flag_parse_init_performed_ = false;
  in_RDI->random_seed_ = 0;
  Random::Random(&in_RDI->random_,0);
  in_RDI->start_timestamp_ = 0;
  in_RDI->elapsed_time_ = 0;
  this_02 = (TestEventListeners *)&in_RDI->internal_run_death_test_flag_;
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,std::default_delete<testing::internal::InternalRunDeathTestFlag>>
  ::unique_ptr<std::default_delete<testing::internal::InternalRunDeathTestFlag>,void>
            ((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
              *)in_stack_ffffffffffffff40);
  this_00 = (ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
             *)operator_new(8);
  DefaultDeathTestFactory::DefaultDeathTestFactory
            ((DefaultDeathTestFactory *)in_stack_ffffffffffffff40);
  std::
  unique_ptr<testing::internal::DeathTestFactory,std::default_delete<testing::internal::DeathTestFactory>>
  ::unique_ptr<std::default_delete<testing::internal::DeathTestFactory>,void>
            ((unique_ptr<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
              *)in_stack_ffffffffffffff40,(pointer)in_stack_ffffffffffffff38);
  listener = &in_RDI->gtest_trace_stack_;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::ThreadLocal(this_00);
  in_RDI->catch_exceptions_ = false;
  this_01 = listeners(in_RDI);
  operator_new(8);
  PrettyUnitTestResultPrinter::PrettyUnitTestResultPrinter((PrettyUnitTestResultPrinter *)this_01);
  TestEventListeners::SetDefaultResultPrinter(this_02,(TestEventListener *)listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
          default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_() global_test_part_result_repoter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_suite_(-1),
      current_test_suite_(nullptr),
      current_test_info_(nullptr),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(nullptr),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),       // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#if GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}